

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,QJsonObject *o)

{
  long lVar1;
  QCborValue *in_RDI;
  long in_FS_OFFSET;
  QCborMap *in_stack_ffffffffffffffc8;
  QJsonObject *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QCborMap::fromJsonObject(in_stack_fffffffffffffff0);
  ::QCborValue::QCborValue(in_RDI,in_stack_ffffffffffffffc8);
  QCborMap::~QCborMap((QCborMap *)0x49fa49);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QJsonValue::QJsonValue(QJsonObject &&o) noexcept
    : value(QCborMap::fromJsonObject(std::move(o)))
{
}